

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::BuildBlockSplit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *block_ids,BlockSplit *split)

{
  pointer *ppuVar1;
  byte bVar2;
  iterator iVar3;
  iterator iVar4;
  byte bVar5;
  byte *pbVar6;
  pointer puVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint8_t cur_id;
  byte local_3d;
  uint local_3c;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_38;
  
  pbVar6 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = *pbVar6;
  local_3c = 1;
  puVar7 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar10 = bVar5;
  local_3d = bVar5;
  if (1 < (ulong)((long)puVar7 - (long)pbVar6)) {
    local_38 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&split->types;
    uVar8 = 1;
    bVar9 = bVar5;
    do {
      bVar2 = pbVar6[uVar8];
      if (bVar2 != bVar9) {
        iVar3._M_current =
             (split->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (split->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>(local_38,iVar3,&local_3d);
        }
        else {
          *iVar3._M_current = bVar9;
          ppuVar1 = &(split->types).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        iVar4._M_current =
             (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&split->lengths,iVar4,
                     &local_3c);
        }
        else {
          *iVar4._M_current = local_3c;
          (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        bVar5 = bVar2;
        if (bVar2 < bVar10) {
          bVar5 = bVar10;
        }
        bVar10 = bVar5;
        pbVar6 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar7 = (block_ids->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        local_3c = 0;
        bVar5 = bVar2;
        local_3d = bVar2;
      }
      local_3c = local_3c + 1;
      uVar8 = uVar8 + 1;
      bVar9 = bVar2;
    } while (uVar8 < (ulong)((long)puVar7 - (long)pbVar6));
  }
  iVar3._M_current =
       (split->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (split->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&split->types,iVar3,&local_3d)
    ;
  }
  else {
    *iVar3._M_current = bVar5;
    ppuVar1 = &(split->types).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar4._M_current =
       (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&split->lengths,iVar4,&local_3c)
    ;
  }
  else {
    *iVar4._M_current = local_3c;
    (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  split->num_types = (ulong)bVar10 + 1;
  return;
}

Assistant:

void BuildBlockSplit(const std::vector<uint8_t>& block_ids, BlockSplit* split) {
  uint8_t cur_id = block_ids[0];
  uint8_t max_type = cur_id;
  uint32_t cur_length = 1;
  for (size_t i = 1; i < block_ids.size(); ++i) {
    uint8_t next_id = block_ids[i];
    if (next_id != cur_id) {
      split->types.push_back(cur_id);
      split->lengths.push_back(cur_length);
      max_type = std::max(max_type, next_id);
      cur_id = next_id;
      cur_length = 0;
    }
    ++cur_length;
  }
  split->types.push_back(cur_id);
  split->lengths.push_back(cur_length);
  split->num_types = static_cast<size_t>(max_type) + 1;
}